

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLFeeder_Easy::ExportPreproData(NLFeeder_Easy *this,PreprocessData *pd)

{
  int iVar1;
  NLModel *pNVar2;
  size_type sVar3;
  reference pvVar4;
  size_type __n;
  NLFeeder_Easy *in_RSI;
  NLFeeder_Easy *in_RDI;
  size_type i;
  int in_stack_ffffffffffffffcc;
  size_type in_stack_ffffffffffffffe8;
  NLFeeder_Easy *this_00;
  
  this_00 = in_RSI;
  pNVar2 = NLME(in_RDI);
  NLModel::NumCols(pNVar2);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffe8);
  pNVar2 = NLME(in_RDI);
  NLModel::NumCols(pNVar2);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffe8);
  sVar3 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this_00)
  ;
  while (__n = sVar3 - 1, sVar3 != 0) {
    iVar1 = VPerm(in_RSI,in_stack_ffffffffffffffcc);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_00,__n);
    *pvVar4 = iVar1;
    in_stack_ffffffffffffffcc = VPermInv(in_RSI,in_stack_ffffffffffffffcc);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&(this_00->nlme_).vars_.upper_,__n);
    *pvVar4 = in_stack_ffffffffffffffcc;
    sVar3 = __n;
  }
  return;
}

Assistant:

void ExportPreproData(NLModel::PreprocessData &pd) {
    pd.vperm_.resize(NLME().NumCols());
    pd.vperm_inv_.resize(NLME().NumCols());
    for (auto i=pd.vperm_.size(); i--; ) {
      pd.vperm_[i] = VPerm(i);
      pd.vperm_inv_[i] = VPermInv(i);
    }
  }